

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PopTextWrapPos(void)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  uint uVar3;
  float fVar4;
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  iVar1 = (pIVar2->DC).TextWrapPosStack.Size;
  if (iVar1 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.h"
                  ,0x544,"void ImVector<float>::pop_back() [T = float]");
  }
  uVar3 = iVar1 - 1;
  (pIVar2->DC).TextWrapPosStack.Size = uVar3;
  if (uVar3 == 0) {
    fVar4 = -1.0;
  }
  else {
    if (iVar1 == 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.h"
                    ,0x538,"T &ImVector<float>::back() [T = float]");
    }
    fVar4 = (pIVar2->DC).TextWrapPosStack.Data[(ulong)uVar3 - 1];
  }
  (pIVar2->DC).TextWrapPos = fVar4;
  return;
}

Assistant:

void ImGui::PopTextWrapPos()
{
    ImGuiWindow* window = GetCurrentWindow();
    window->DC.TextWrapPosStack.pop_back();
    window->DC.TextWrapPos = window->DC.TextWrapPosStack.empty() ? -1.0f : window->DC.TextWrapPosStack.back();
}